

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O3

string * json_escape(string *__return_storage_ptr__,string *inS)

{
  string *psVar1;
  string *psVar2;
  string *psVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (inS->_M_string_length != 0) {
    psVar3 = (string *)0x0;
    psVar1 = (string *)0x1;
    do {
      psVar2 = psVar1;
      if (escapes[(byte)(inS->_M_dataplus)._M_p[(long)&(psVar3->_M_dataplus)._M_p]] == (char *)0x0)
      {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      psVar3 = psVar2;
      psVar1 = (string *)(ulong)((int)psVar2 + 1);
    } while (psVar2 < (string *)inS->_M_string_length);
  }
  return psVar2;
}

Assistant:

static std::string json_escape(const std::string& inS)
{
    std::string outS;
    outS.reserve(inS.size() * 2);

    for (unsigned int i = 0; i < inS.size(); i++) {
        unsigned char ch = inS[i];
        const char *escStr = escapes[ch];

        if (escStr)
            outS += escStr;
        else
            outS += ch;
    }

    return outS;
}